

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Multiqueues.h
# Opt level: O1

int __thiscall
Multiqueues<int>::getQueueIndexForDelete(Multiqueues<int> *this,int queueIndex,int secondQueueIndex)

{
  PriorityQueue *pPVar1;
  pointer p_Var2;
  pointer p_Var3;
  int iVar4;
  int iVar5;
  
  pPVar1 = this->internalQueues;
  p_Var2 = pPVar1[queueIndex].super_type.q_.q_.
           super__Vector_base<std::_List_iterator<std::pair<int,_unsigned_long>_>,_std::allocator<std::_List_iterator<std::pair<int,_unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  p_Var3 = pPVar1[queueIndex].super_type.q_.q_.
           super__Vector_base<std::_List_iterator<std::pair<int,_unsigned_long>_>,_std::allocator<std::_List_iterator<std::pair<int,_unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (p_Var2 == p_Var3) {
    if (pPVar1[secondQueueIndex].super_type.q_.q_.
        super__Vector_base<std::_List_iterator<std::pair<int,_unsigned_long>_>,_std::allocator<std::_List_iterator<std::pair<int,_unsigned_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        pPVar1[secondQueueIndex].super_type.q_.q_.
        super__Vector_base<std::_List_iterator<std::pair<int,_unsigned_long>_>,_std::allocator<std::_List_iterator<std::pair<int,_unsigned_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      return -1;
    }
    if ((p_Var2 == p_Var3) &&
       (pPVar1[secondQueueIndex].super_type.q_.q_.
        super__Vector_base<std::_List_iterator<std::pair<int,_unsigned_long>_>,_std::allocator<std::_List_iterator<std::pair<int,_unsigned_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        pPVar1[secondQueueIndex].super_type.q_.q_.
        super__Vector_base<std::_List_iterator<std::pair<int,_unsigned_long>_>,_std::allocator<std::_List_iterator<std::pair<int,_unsigned_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) goto LAB_00103813;
  }
  do {
    iVar4 = pthread_mutex_trylock((pthread_mutex_t *)(this->locks + queueIndex));
  } while (iVar4 != 0);
  p_Var2 = this->internalQueues[queueIndex].super_type.q_.q_.
           super__Vector_base<std::_List_iterator<std::pair<int,_unsigned_long>_>,_std::allocator<std::_List_iterator<std::pair<int,_unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (p_Var2 == this->internalQueues[queueIndex].super_type.q_.q_.
                super__Vector_base<std::_List_iterator<std::pair<int,_unsigned_long>_>,_std::allocator<std::_List_iterator<std::pair<int,_unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    iVar4 = -1;
  }
  else {
    iVar4 = *(int *)&p_Var2->_M_node[1]._M_next;
  }
  pthread_mutex_unlock((pthread_mutex_t *)(this->locks + queueIndex));
  do {
    iVar5 = pthread_mutex_trylock((pthread_mutex_t *)(this->locks + secondQueueIndex));
  } while (iVar5 != 0);
  p_Var2 = this->internalQueues[secondQueueIndex].super_type.q_.q_.
           super__Vector_base<std::_List_iterator<std::pair<int,_unsigned_long>_>,_std::allocator<std::_List_iterator<std::pair<int,_unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (p_Var2 == this->internalQueues[secondQueueIndex].super_type.q_.q_.
                super__Vector_base<std::_List_iterator<std::pair<int,_unsigned_long>_>,_std::allocator<std::_List_iterator<std::pair<int,_unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    iVar5 = -1;
  }
  else {
    iVar5 = *(int *)&p_Var2->_M_node[1]._M_next;
  }
  pthread_mutex_unlock((pthread_mutex_t *)(this->locks + secondQueueIndex));
  if (iVar5 <= iVar4) {
    secondQueueIndex = queueIndex;
  }
LAB_00103813:
  if (secondQueueIndex == -1) {
    return -1;
  }
  if (this->internalQueues[secondQueueIndex].super_type.q_.q_.
      super__Vector_base<std::_List_iterator<std::pair<int,_unsigned_long>_>,_std::allocator<std::_List_iterator<std::pair<int,_unsigned_long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      this->internalQueues[secondQueueIndex].super_type.q_.q_.
      super__Vector_base<std::_List_iterator<std::pair<int,_unsigned_long>_>,_std::allocator<std::_List_iterator<std::pair<int,_unsigned_long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    return -1;
  }
  return secondQueueIndex;
}

Assistant:

int getQueueIndexForDelete(int queueIndex, int secondQueueIndex) const {
        if (internalQueues[queueIndex].empty() && internalQueues[secondQueueIndex].empty()) {
            return -1;
        } else if (internalQueues[queueIndex].empty() && !internalQueues[secondQueueIndex].empty()) {
            queueIndex = secondQueueIndex;
        } else {
            while (!locks[queueIndex].try_lock());
            int value = -1;
            if (!internalQueues[queueIndex].empty())
                value = internalQueues[queueIndex].top();
            locks[queueIndex].unlock();
            while (!locks[secondQueueIndex].try_lock());
            int value2 = -1;
            if (!internalQueues[secondQueueIndex].empty())
                value2 = internalQueues[secondQueueIndex].top();
            locks[secondQueueIndex].unlock();
            if (value2 > value) {
                queueIndex = secondQueueIndex;
            }
        }

        if (queueIndex != -1 && internalQueues[queueIndex].empty()) {
            return -1;
        }
        return queueIndex;
    }